

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall mocker::Annotator::~Annotator(Annotator *this)

{
  Annotator *this_local;
  
  (this->super_Visitor).super_VisitorBase<false,_true>._vptr_VisitorBase =
       (_func_int **)&PTR_operator___0039e870;
  std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr(&this->builtinNull);
  std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr(&this->builtinString);
  std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr(&this->builtinBool);
  std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr(&this->builtinInt);
  std::shared_ptr<mocker::ast::Type>::~shared_ptr(&this->retType);
  ScopeID::~ScopeID(&this->scopeResiding);
  return;
}

Assistant:

Annotator(ScopeID scopeResiding, SemanticContext &ctx,
            std::unordered_map<ast::NodeID, PosPair> &pos, bool inLoop,
            bool inFunc, std::shared_ptr<ast::Type> retType)
      : scopeResiding(std::move(scopeResiding)), ctx(ctx), pos(pos),
        inLoop(inLoop), inFunc(inFunc), retType(std::move(retType)) {
    builtinBool = mk_ast::tyBool();
    builtinInt = mk_ast::tyInt();
    builtinNull = mk_ast::tyNull();
    builtinString = mk_ast::tyString();
  }